

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O1

void __thiscall
blcl::net::server_interface<MsgType>::server_interface
          (server_interface<MsgType> *this,uint16_t port)

{
  data_union local_48;
  
  this->_vptr_server_interface = (_func_int **)&PTR__server_interface_001204b8;
  (this->incoming_messages_)._vptr_tsqueue = (_func_int **)&PTR__tsqueue_001204f8;
  (this->incoming_messages_).queue_mtx_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->incoming_messages_).queue_mtx_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->incoming_messages_).queue_mtx_.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->incoming_messages_).queue_mtx_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->incoming_messages_).queue_mtx_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->incoming_messages_).raw_deque_.
  super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
  ::_M_initialize_map(&(this->incoming_messages_).raw_deque_.
                       super__Deque_base<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
                      ,0);
  std::condition_variable::condition_variable(&(this->incoming_messages_).to_update_cv_);
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->incoming_messages_).to_update_mtx_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->connections_).
  super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(undefined8 *)
   ((long)&(this->incoming_messages_).to_update_mtx_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->incoming_messages_).to_update_mtx_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->incoming_messages_).to_update_mtx_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->incoming_messages_).to_update_mtx_.super___mutex_base._M_mutex + 8)
       = 0;
  std::
  _Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  ::_M_initialize_map(&(this->connections_).
                       super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
                      ,0);
  asio::io_context::io_context(&this->context_);
  (this->ctx_thread_)._M_id._M_thread = 0;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_48.v4.sin_port = port << 8 | port >> 8;
  local_48.base.sa_family = 2;
  local_48.v6.sin6_flowinfo = 0;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            (&this->asio_acceptor_,&this->context_,(endpoint_type *)&local_48.base,true,0);
  this->id_counter_ = 10000;
  return;
}

Assistant:

server_interface(uint16_t port)
            : asio_acceptor_(context_, asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port))
        {

        }